

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O2

void __thiscall
pugi::impl::anon_unknown_0::xpath_node_set_raw::remove_duplicates
          (xpath_node_set_raw *this,xpath_allocator *alloc)

{
  xml_node_struct *pxVar1;
  xml_attribute_struct *pxVar2;
  ulong uVar3;
  void *__s;
  xml_node xVar4;
  xpath_node *pxVar5;
  xpath_node *pxVar6;
  xpath_node *pxVar7;
  long lVar8;
  xpath_node *pxVar9;
  ulong uVar10;
  uint uVar11;
  ulong uVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  xpath_allocator_capture cr;
  xpath_node_set_raw *pxVar12;
  
  if (this->_type == type_unsorted) {
    pxVar9 = this->_begin;
    pxVar5 = this->_end;
    uVar10 = (long)pxVar5 - (long)pxVar9;
    if (0x20 < (long)uVar10) {
      cr._state._root = alloc->_root;
      cr._state._root_size = alloc->_root_size;
      cr._state._error = alloc->_error;
      uVar3 = 1;
      do {
        uVar13 = uVar3;
        uVar3 = uVar13 * 2;
      } while (uVar13 < (uVar10 >> 5) + (uVar10 >> 4));
      cr._target = alloc;
      __s = xpath_allocator::allocate(alloc,uVar13 * 8);
      if (__s != (void *)0x0) {
        memset(__s,0,uVar13 * 8);
        uVar13 = uVar13 - 1;
        pxVar9 = this->_begin;
        for (pxVar5 = pxVar9; pxVar5 != this->_end; pxVar5 = pxVar5 + 1) {
          pxVar1 = (xml_node_struct *)(pxVar5->_attribute)._attr;
          xVar4 = xpath_node::node(pxVar5);
          if (pxVar1 != (xml_node_struct *)0x0) {
            xVar4._root = pxVar1;
          }
          if (xVar4._root != (xml_node_struct *)0x0) {
            uVar11 = ((uint)((ulong)xVar4._root >> 0x10) & 0xffff ^ (uint)xVar4._root) * -0x7a143595
            ;
            uVar11 = (uVar11 >> 0xd ^ uVar11) * -0x3d4d51cb;
            uVar10 = (ulong)((uVar11 >> 0x10 ^ uVar11) & (uint)uVar13);
            lVar8 = 1;
            while( true ) {
              if (uVar13 < lVar8 - 1U) {
                __assert_fail("false && \"Hash table is full\"",
                              "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/libs/pugixml/src/pugixml.cpp"
                              ,0x1d53,
                              "bool pugi::impl::(anonymous namespace)::hash_insert(const void **, size_t, const void *)"
                             );
              }
              pxVar1 = *(xml_node_struct **)((long)__s + uVar10 * 8);
              if (pxVar1 == (xml_node_struct *)0x0) break;
              if (pxVar1 == xVar4._root) goto LAB_00180753;
              uVar10 = uVar10 + lVar8 & uVar13;
              lVar8 = lVar8 + 1;
            }
            *(xml_node_struct **)((long)__s + uVar10 * 8) = xVar4._root;
            pxVar2 = (pxVar5->_attribute)._attr;
            (pxVar9->_node)._root = (pxVar5->_node)._root;
            (pxVar9->_attribute)._attr = pxVar2;
            pxVar9 = pxVar9 + 1;
          }
LAB_00180753:
        }
        this->_end = pxVar9;
      }
      xpath_allocator_capture::~xpath_allocator_capture(&cr);
      return;
    }
  }
  else {
    pxVar9 = this->_begin;
    pxVar5 = this->_end;
  }
  uVar10 = (long)pxVar5 - (long)pxVar9;
  pxVar12 = this;
  do {
    pxVar7 = pxVar9;
    if ((long)uVar10 < 0x11) break;
    auVar16._0_4_ = -(uint)(*(int *)&pxVar7[1]._node._root == *(int *)&(pxVar7->_node)._root);
    auVar16._4_4_ =
         -(uint)(*(int *)((long)&pxVar7[1]._node._root + 4) ==
                *(int *)((long)&(pxVar7->_node)._root + 4));
    auVar16._8_4_ =
         -(uint)(*(int *)&pxVar7[1]._attribute._attr == *(int *)&(pxVar7->_attribute)._attr);
    auVar16._12_4_ =
         -(uint)(*(int *)((long)&pxVar7[1]._attribute._attr + 4) ==
                *(int *)((long)&(pxVar7->_attribute)._attr + 4));
    auVar14._4_4_ = auVar16._0_4_;
    auVar14._0_4_ = auVar16._4_4_;
    auVar14._8_4_ = auVar16._12_4_;
    auVar14._12_4_ = auVar16._8_4_;
    uVar11 = movmskpd((int)pxVar12,auVar14 & auVar16);
    pxVar12 = (xpath_node_set_raw *)(ulong)uVar11;
    uVar10 = uVar10 - 0x10;
    pxVar9 = pxVar7 + 1;
  } while (uVar11 != 3);
  pxVar9 = pxVar7;
  if (pxVar7 != pxVar5) {
    while (pxVar6 = pxVar9, pxVar9 = pxVar6 + 1, pxVar9 != pxVar5) {
      auVar17._0_4_ = -(uint)(*(int *)&(pxVar7->_node)._root == *(int *)&(pxVar9->_node)._root);
      auVar17._4_4_ =
           -(uint)(*(int *)((long)&(pxVar7->_node)._root + 4) ==
                  *(int *)((long)&pxVar6[1]._node._root + 4));
      auVar17._8_4_ =
           -(uint)(*(int *)&(pxVar7->_attribute)._attr == *(int *)&pxVar6[1]._attribute._attr);
      auVar17._12_4_ =
           -(uint)(*(int *)((long)&(pxVar7->_attribute)._attr + 4) ==
                  *(int *)((long)&pxVar6[1]._attribute._attr + 4));
      auVar15._4_4_ = auVar17._0_4_;
      auVar15._0_4_ = auVar17._4_4_;
      auVar15._8_4_ = auVar17._12_4_;
      auVar15._12_4_ = auVar17._8_4_;
      uVar11 = movmskpd((int)uVar10,auVar15 & auVar17);
      uVar10 = (ulong)uVar11;
      if (uVar11 != 3) {
        pxVar2 = pxVar6[1]._attribute._attr;
        pxVar7[1]._node._root = (pxVar9->_node)._root;
        pxVar7[1]._attribute._attr = pxVar2;
        pxVar7 = pxVar7 + 1;
      }
    }
    pxVar7 = pxVar7 + 1;
  }
  this->_end = pxVar7;
  return;
}

Assistant:

void remove_duplicates(xpath_allocator* alloc)
		{
			if (_type == xpath_node_set::type_unsorted && _end - _begin > 2)
			{
				xpath_allocator_capture cr(alloc);

				size_t size_ = static_cast<size_t>(_end - _begin);

				size_t hash_size = 1;
				while (hash_size < size_ + size_ / 2) hash_size *= 2;

				const void** hash_data = static_cast<const void**>(alloc->allocate(hash_size * sizeof(void**)));
				if (!hash_data) return;

				memset(hash_data, 0, hash_size * sizeof(const void**));

				xpath_node* write = _begin;

				for (xpath_node* it = _begin; it != _end; ++it)
				{
					const void* attr = it->attribute().internal_object();
					const void* node = it->node().internal_object();
					const void* key = attr ? attr : node;

					if (key && hash_insert(hash_data, hash_size, key))
					{
						*write++ = *it;
					}
				}

				_end = write;
			}
			else
			{
				_end = unique(_begin, _end);
			}
		}